

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccmdutl.cpp
# Opt level: O2

int CTcCommandUtil::parse_opt_file(osfildef *fp,char **argv,CTcOptFileHelper *helper)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *dst;
  ulong __n;
  char *pcVar9;
  char cVar10;
  size_t __n_00;
  char *pcVar11;
  long local_e0;
  CTcOptFileHelperDefault default_helper;
  char config_id [128];
  
  default_helper.super_CTcOptFileHelper._vptr_CTcOptFileHelper =
       (CTcOptFileHelper)&PTR_alloc_opt_file_str_00305438;
  if (helper == (CTcOptFileHelper *)0x0) {
    helper = &default_helper.super_CTcOptFileHelper;
  }
  __n_00 = 0x200;
  iVar2 = (**helper->_vptr_CTcOptFileHelper)(helper,0x200);
  config_id[0] = '\0';
  local_e0 = 0;
  pcVar11 = (char *)CONCAT44(extraout_var,iVar2);
LAB_001f6a5b:
  pcVar3 = fgets(pcVar11,(int)__n_00,(FILE *)fp);
  if (pcVar3 == (char *)0x0) {
    (*helper->_vptr_CTcOptFileHelper[1])(helper,pcVar11);
    return (int)local_e0;
  }
  do {
    sVar7 = __n_00 + 0x200;
    sVar4 = strlen(pcVar11);
    pcVar3 = pcVar11;
    if ((sVar4 != 0) && ((pcVar11[sVar4 - 1] == '\r' || (pcVar11[sVar4 - 1] == '\n'))))
    goto LAB_001f6b13;
    if (__n_00 - 1 != sVar4) break;
    iVar2 = (**helper->_vptr_CTcOptFileHelper)(helper,sVar7);
    pcVar3 = (char *)CONCAT44(extraout_var_00,iVar2);
    memcpy(pcVar3,pcVar11,__n_00);
    (*helper->_vptr_CTcOptFileHelper[1])(helper,pcVar11);
    pcVar5 = fgets(pcVar3 + sVar4,(int)sVar7 - (int)sVar4,(FILE *)fp);
    __n_00 = sVar7;
    pcVar11 = pcVar3;
  } while (pcVar5 != (char *)0x0);
  goto LAB_001f6b31;
  while ((sVar4 = sVar7 - 1, pcVar11[sVar7 - 1] == '\r' || (pcVar11[sVar7 - 1] == '\n'))) {
LAB_001f6b13:
    sVar7 = sVar4;
    if (sVar7 == 0) break;
  }
  pcVar11[sVar7] = '\0';
LAB_001f6b31:
  pcVar5 = pcVar3 + -1;
  do {
    pcVar8 = pcVar5;
    pcVar5 = pcVar8 + 1;
    iVar2 = isspace((int)pcVar8[1]);
  } while (iVar2 != 0);
  sVar4 = strlen(pcVar5);
  pcVar11 = pcVar3;
  if ((sVar4 < 9) || (iVar2 = memicmp(pcVar5,"[config:",8), iVar2 != 0)) {
    if (config_id[0] == '\0') {
      if ((*pcVar5 == '#') || (*pcVar5 == '\0')) {
        (*helper->_vptr_CTcOptFileHelper[2])(helper,pcVar3);
      }
      else {
        (*helper->_vptr_CTcOptFileHelper[3])(helper,pcVar3);
        local_e0 = (long)(int)local_e0;
        while (cVar10 = *pcVar3, pcVar5 = pcVar3, cVar10 != '\0') {
          while( true ) {
            pcVar8 = pcVar5 + 1;
            iVar2 = isspace((int)cVar10);
            if (iVar2 == 0) break;
            cVar10 = *pcVar8;
            pcVar5 = pcVar8;
          }
          pcVar3 = pcVar8;
          pcVar9 = pcVar8;
          if (cVar10 == '\"') {
            do {
              cVar10 = *pcVar3;
              if (cVar10 == '\"') {
                pcVar6 = pcVar3 + 1;
                pcVar1 = pcVar3 + 1;
                pcVar3 = pcVar6;
                pcVar5 = pcVar8;
                if (*pcVar1 != '\"') goto LAB_001f6cd8;
              }
              else {
                pcVar6 = pcVar3;
                pcVar5 = pcVar8;
                if (cVar10 == '\0') goto LAB_001f6cd8;
              }
              *pcVar9 = cVar10;
              pcVar3 = pcVar6 + 1;
              pcVar9 = pcVar9 + 1;
            } while( true );
          }
          pcVar3 = pcVar5;
          if (cVar10 == '\0') break;
          while ((pcVar9 = pcVar3, cVar10 != '\0' && (iVar2 = isspace((int)cVar10), iVar2 == 0))) {
            cVar10 = pcVar3[1];
            pcVar3 = pcVar3 + 1;
          }
LAB_001f6cd8:
          if (argv != (char **)0x0) {
            sVar4 = (long)pcVar9 - (long)pcVar5;
            iVar2 = (**helper->_vptr_CTcOptFileHelper)(helper,sVar4 + 1);
            argv[local_e0] = (char *)CONCAT44(extraout_var_01,iVar2);
            memcpy((char *)CONCAT44(extraout_var_01,iVar2),pcVar5,sVar4);
            argv[local_e0][sVar4] = '\0';
          }
          local_e0 = local_e0 + 1;
        }
      }
    }
    else {
      (*helper->_vptr_CTcOptFileHelper[4])(helper,config_id,pcVar3,0);
    }
  }
  else {
    __n = 0;
    for (pcVar5 = pcVar8 + 9; (*pcVar5 != '\0' && (*pcVar5 != ']')); pcVar5 = pcVar5 + 1) {
      __n = __n + 1;
    }
    if (0x7e < __n) {
      __n = 0x7f;
    }
    memcpy(config_id,pcVar8 + 9,__n);
    config_id[__n] = '\0';
    (*helper->_vptr_CTcOptFileHelper[4])(helper,config_id,pcVar3,1);
  }
  goto LAB_001f6a5b;
}

Assistant:

int CTcCommandUtil::parse_opt_file(osfildef *fp, char **argv,
                                   CTcOptFileHelper *helper)
{
    char *buf;
    char config_id[128];
    size_t buflen;
    int argc;
    CTcOptFileHelperDefault default_helper;

    /* if they didn't give us a helper object, use our default */
    if (helper == 0)
        helper = &default_helper;

    /* allocate our initial buffer */
    buflen = 512;
    buf = helper->alloc_opt_file_str(buflen);

    /* we're not in a configuration section yet */
    config_id[0] = '\0';

    /* keep going until we run out of text in the file */
    for (argc = 0 ; ; )
    {
        size_t len;
        char *p;

        /* read the next line - stop if we're done */
        if (osfgets(buf, buflen, fp) == 0)
            break;

        /* check for proper termination */
        for (;;)
        {
            /* get the buffer length */
            len = strlen(buf);

            /* check for a newline of some kind at the end */
            if (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r'))
            {
                /* 
                 *   remove consecutive newline/return characters - in case
                 *   we are using a file moved from another system with
                 *   incompatible newline conventions, simply remove all of
                 *   the newlines we find 
                 */
                while (len != 0
                       && (buf[len-1] == '\n' || buf[len - 1] == '\r'))
                    --len;

                /* null-terminate the line */
                buf[len] = '\0';

                /* we now have our line */
                break;
            }
            else if (len == buflen - 1)
            {
                char *new_buf;
                size_t new_buf_len;
                
                /* 
                 *   The buffer was completely filled, and wasn't
                 *   null-terminated - the line must be too long for the
                 *   buffer.  Expand the buffer and go back for more.  
                 */
                new_buf_len = buflen + 512;
                new_buf = helper->alloc_opt_file_str(new_buf_len);

                /* copy the old buffer into the new buffer */
                memcpy(new_buf, buf, buflen);

                /* discard the old buffer */
                helper->free_opt_file_str(buf);

                /* switch to the new buffer */
                buf = new_buf;
                buflen = new_buf_len;

                /* append more data into the line buffer and try again */
                if (osfgets(buf + len, buflen - len, fp) == 0)
                    break;
            }
            else
            {
                /* 
                 *   The buffer wasn't completely full, and we didn't find a
                 *   newline.  This must mean that we've reached the end of
                 *   the file, so we've read as much as we can for this
                 *   line.  
                 */
                break;
            }
        }

        /* skip leading spaces */
        for (p = buf ; isspace(*p) ; ++p) ;

        /*
         *   Check to see if we're entering a new configuration section.  If
         *   the line matches the pattern "[Config:xxx]", then we're starting
         *   a new configuration section with identifier "xxx". 
         */
        if (strlen(p) > 8 && memicmp(p, "[config:", 8) == 0)
        {
            char *start;
            size_t copy_len;
            
            /* 
             *   note the part after the colon and up to the closing bracket
             *   - it's the ID of this configuration section 
             */
            for (p += 8, start = p ; *p != ']' && *p != '\0' ; ++p) ;

            /* limit the ID size to our buffer maximum */
            copy_len = p - start;
            if (copy_len > sizeof(config_id) - 1)
                copy_len = sizeof(config_id) - 1;

            /* copy and null-terminate the ID string */
            memcpy(config_id, start, copy_len);
            config_id[copy_len] = '\0';

            /* process the configuration ID line itself as a config line */
            helper->process_config_line(config_id, buf, TRUE);

            /* we're done processing this line */
            continue;
        }

        /* 
         *   if we're in a configuration section, simply process the line
         *   through the helper as a configuration line - this doesn't
         *   contain any options we can parse, since configuration sections
         *   are private to their respective definers 
         */
        if (config_id[0] != '\0')
        {
            /* process the configuration line through the helper */
            helper->process_config_line(config_id, buf, FALSE);

            /* we're done with this line */
            continue;
        }
        
        /* 
         *   If we've reached the end of the line or a command character
         *   ('#'), we're done with this line.  Note that we check for
         *   comments AFTER checking to see if we're in a config section,
         *   because we want to send any comment lines within a config
         *   section to the helper for processing as part of the config -
         *   even comments are opaque to us within a config section.  
         */
        if (*p == '\0' || *p == '#')
        {
            /* tell the helper about the comment */
            helper->process_comment_line(buf);

            /* we're done with the line - go back for the next one */
            continue;
        }

        /* tell the helper about the non-comment line */
        helper->process_non_comment_line(buf);

        /* parse the options on this line */
        for (p = buf ; *p != '\0' ; )
        {
            char *start;
            size_t arg_len;

            /* skip leading spaces */
            for ( ; isspace(*p) ; ++p) ;

            /* check to see if we reached the end of the line */
            if (*p == '\0')
                break;

            /* 
             *   if the argument is quoted, find the matching quote;
             *   otherwise, look for the next space 
             */
            if (*p == '"')
            {
                char *dst;

                /* find the matching quote */
                for (++p, start = dst = p ; *p != '\0' ; ++p)
                {
                    /* 
                     *   if this is a quote, check for stuttering - if it's
                     *   stuttered, treat it as a single quote (and convert
                     *   it to same), otherwise we've reached the end of the
                     *   argument 
                     */
                    if (*p == '"')
                    {
                        /* check for stuttering */
                        if (*(p+1) == '"')
                        {
                            /* 
                             *   it's stuttered - skip the extra quote, so
                             *   that we copy only a single quote 
                             */
                            ++p;
                        }
                        else
                        {
                            /* this is our closing quote - skip it */
                            ++p;

                            /* we're done with the argument */
                            break;
                        }
                    }

                    /* copy this character to the output */
                    *dst++ = *p;
                }

                /* note the length of the argument */
                arg_len = dst - start;
            }
            else
            {
                /* find the next space */
                for (start = p ; *p != '\0' && !isspace(*p) ; ++p) ;

                /* note the length of the argument */
                arg_len = p - start;
            }

            /* store the argument if we have an output vector */
            if (argv != 0)
            {
                /* allocate the argument */
                argv[argc] = helper->alloc_opt_file_str(arg_len + 1);

                /* copy it into the result */
                memcpy(argv[argc], start, arg_len);
                argv[argc][arg_len] = '\0';
            }

            /* count the argument */
            ++argc;
        }
    }

    /* done with our line buffer - delete it */
    helper->free_opt_file_str(buf);

    /* return the argument count */
    return argc;
}